

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmjni.c
# Opt level: O2

jint Java_jportmidi_JPortMidiApi_Pm_1OpenInput
               (JNIEnv *env,jclass cl,jobject jstream,jint index,jstring extras,jint bufsiz)

{
  PmError PVar1;
  PortMidiStream *in_RAX;
  jclass p_Var2;
  jfieldID p_Var3;
  PortMidiStream *stream;
  PortMidiStream *local_38;
  
  local_38 = in_RAX;
  p_Var2 = (*(*env)->GetObjectClass)(env,jstream);
  p_Var3 = (*(*env)->GetFieldID)(env,p_Var2,"address","J");
  PVar1 = Pm_OpenInput(&local_38,index,(void *)0x0,bufsiz,(PmTimeProcPtr)0x0,(void *)0x0);
  (*(*env)->SetLongField)(env,jstream,p_Var3,(jlong)local_38);
  return PVar1;
}

Assistant:

JNICALL Java_jportmidi_JPortMidiApi_Pm_1OpenInput
  (JNIEnv *env, jclass cl, 
   jobject jstream, jint index, jstring extras, jint bufsiz)
{
    PmError rslt;
    PortMidiStream *stream;
    CLASS(c, jstream);
    ADDRESS_FID(fid, c);
    rslt = Pm_OpenInput(&stream, index, NULL, bufsiz, NULL, NULL);
    SET_PMSTREAM(jstream, fid, stream);
    return rslt;
}